

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

uint __thiscall v128::To<unsigned_int>(v128 *this,int lane)

{
  uint local_18;
  int local_14;
  uint result;
  int lane_local;
  v128 *this_local;
  
  local_14 = lane;
  _result = this;
  if ((ulong)((long)(lane + 1) * 4) < 0x11) {
    wabt::MemcpyEndianAware(&local_18,this,4,0x10,0,(long)lane << 2,4);
    return local_18;
  }
  __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/common.h"
                ,0x8b,"T v128::To(int) const [T = unsigned int]");
}

Assistant:

T To(int lane) const {
    static_assert(sizeof(T) <= sizeof(v), "Invalid cast!");
    assert((lane + 1) * sizeof(T) <= sizeof(v));
    T result;
    wabt::MemcpyEndianAware(&result, v, sizeof(result), sizeof(v), 0,
                            lane * sizeof(T), sizeof(result));
    return result;
  }